

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::insert
          (SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  uint var_00;
  long *plVar1;
  UnresolvedSplitRecord obj;
  TermList ts;
  TermList ts_00;
  TermList ts_01;
  TermList val;
  Node *pNVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  IntermediateNode *pIVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TermList *pTVar8;
  undefined4 extraout_var_01;
  Leaf *pLVar9;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *in_RSI;
  uint *in_RDI;
  Top TVar10;
  UnresolvedSplitRecord UVar11;
  Elem EVar12;
  Binding BVar13;
  Leaf *leaf_1;
  uint x;
  Term *t;
  Term *s;
  Stack<Kernel::TermList_*> subterms;
  TermList *ss;
  TermList *tt;
  Leaf *lnode;
  IntermediateNode *inode_2;
  Binding b;
  TermList *term_2;
  uint *var;
  StlIter __end3;
  StlIter __begin3;
  IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
  *__range3;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  remainingBindings;
  Node **pparent;
  TermList term;
  uint boundVar;
  IntermediateNode *inode;
  Node **nodePosition;
  IntermediateNode *newNode;
  Node *node;
  UnresolvedSplitRecord urr;
  bool wouldDescendIntoChild;
  TermList term_1;
  bool removeProblematicNode;
  Node *child;
  uint boundVar_1;
  UArrIntermediateNode *inode_1;
  bool canPostponeSplits;
  Leaf *leaf;
  Node **pnode;
  undefined4 in_stack_fffffffffffffaf8;
  uint in_stack_fffffffffffffafc;
  TermList in_stack_fffffffffffffb00;
  TermList in_stack_fffffffffffffb08;
  undefined4 in_stack_fffffffffffffb10;
  undefined1 in_stack_fffffffffffffb14;
  undefined1 in_stack_fffffffffffffb15;
  undefined1 in_stack_fffffffffffffb16;
  undefined1 in_stack_fffffffffffffb17;
  Term *in_stack_fffffffffffffb18;
  undefined7 in_stack_fffffffffffffb20;
  undefined1 in_stack_fffffffffffffb27;
  Term *in_stack_fffffffffffffb28;
  Term *in_stack_fffffffffffffb30;
  int local_3ec;
  undefined1 local_3e8 [48];
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_3b8;
  Entry *local_3b0;
  uint64_t local_3a8;
  UnresolvedSplitRecord local_3a0;
  uint local_38c;
  Entry *local_388;
  uint64_t local_380;
  Term *local_378;
  Term *local_370;
  Entry *local_368;
  uint64_t local_360;
  Stack<Kernel::TermList_*> local_358;
  TermList *local_338;
  Entry **local_330;
  undefined1 local_328 [48];
  Entry *local_2f8;
  Leaf *local_2f0;
  undefined8 local_2e8;
  uint local_2e0;
  undefined8 local_2d8;
  uint local_2d0;
  undefined8 local_2c8;
  uint local_2c0;
  Entry *local_2b8;
  IntermediateNode *local_2b0;
  uint local_2a8;
  Entry *local_2a0;
  uint64_t local_298;
  Binding local_290;
  TermList *local_280;
  uint *local_278;
  Elem local_270;
  undefined1 local_218 [8];
  undefined1 *local_210;
  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
  local_208;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined8 local_1e0;
  undefined4 local_1d8;
  undefined8 local_1cc;
  undefined4 local_1c4;
  uint *local_1c0;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> local_1b8;
  long *local_190;
  undefined8 local_188;
  undefined4 local_180;
  undefined8 local_178;
  undefined4 local_170;
  undefined8 local_164;
  undefined4 local_15c;
  undefined8 *local_158;
  uint64_t local_150;
  uint64_t local_148;
  IntermediateNode *local_140;
  Node *local_138;
  uint local_130;
  TermList local_128;
  uint64_t local_120;
  uint64_t local_118;
  UnresolvedSplitRecord local_110;
  undefined8 local_100;
  undefined4 local_f8;
  undefined8 local_f0;
  undefined4 local_e8;
  undefined8 local_e0;
  undefined4 local_d8;
  undefined1 local_d1;
  uint64_t local_d0;
  byte local_b9;
  Node *local_b8;
  undefined4 local_ac;
  Node *local_a8;
  byte local_99;
  undefined1 local_98 [64];
  undefined1 local_58 [48];
  Leaf *local_28;
  uint *local_20;
  DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *local_10;
  
  local_20 = in_RDI + 2;
  local_10 = in_RSI;
  if (*(long *)local_20 == 0) {
    bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                      (in_RSI);
    if (bVar3) {
      pLVar9 = createLeaf();
      local_28 = pLVar9;
      Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs
                ((Lhs *)in_stack_fffffffffffffb00._content,
                 (Lhs *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
      (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_58);
      Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42669d);
      *(Leaf **)local_20 = local_28;
      return;
    }
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::getOneKey
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               CONCAT17(in_stack_fffffffffffffb17,
                        CONCAT16(in_stack_fffffffffffffb16,
                                 CONCAT15(in_stack_fffffffffffffb15,
                                          CONCAT14(in_stack_fffffffffffffb14,
                                                   in_stack_fffffffffffffb10)))));
    pIVar6 = createIntermediateNode
                       (CONCAT13(in_stack_fffffffffffffb17,
                                 CONCAT12(in_stack_fffffffffffffb16,
                                          CONCAT11(in_stack_fffffffffffffb15,
                                                   in_stack_fffffffffffffb14))));
    *(IntermediateNode **)local_20 = pIVar6;
  }
  bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::isEmpty
                    (local_10);
  if (bVar3) {
    ensureLeafEfficiency((Leaf **)0x426722);
    plVar1 = *(long **)local_20;
    Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs
              ((Lhs *)in_stack_fffffffffffffb00._content,
               (Lhs *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
    (**(code **)(*plVar1 + 0x48))(plVar1,local_98);
    Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42677a);
  }
  else {
    if ((insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
         ::unresolvedSplits == '\0') &&
       (iVar5 = __cxa_guard_acquire(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
                                     ::unresolvedSplits), iVar5 != 0)) {
      Lib::
      BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
      ::BinaryHeap(&insert::unresolvedSplits);
      __cxa_atexit(Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                   ::~BinaryHeap,&insert::unresolvedSplits,&__dso_handle);
      __cxa_guard_release(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::BinaryResolutionConf::Lhs)
                           ::unresolvedSplits);
    }
    Lib::
    BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
    ::reset(&insert::unresolvedSplits);
LAB_004267ff:
    do {
      local_99 = 0;
      uVar7 = (**(code **)(**(long **)local_20 + 0x10))();
      if (((uVar7 & 1) == 0) && (iVar5 = (**(code **)(**(long **)local_20 + 0x28))(), iVar5 == 1)) {
        local_a8 = *(Node **)local_20;
        iVar5 = (*local_a8->_vptr_Node[4])();
        local_99 = iVar5 == 1;
        if ((bool)local_99) {
          local_ac = *(undefined4 *)&local_a8[1]._vptr_Node;
          local_b8 = (Node *)local_a8[1]._term._content;
          local_b9 = 0;
          Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::find
                    ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                     in_stack_fffffffffffffb18,
                     (uint *)CONCAT17(in_stack_fffffffffffffb17,
                                      CONCAT16(in_stack_fffffffffffffb16,
                                               CONCAT15(in_stack_fffffffffffffb15,
                                                        CONCAT14(in_stack_fffffffffffffb14,
                                                                 in_stack_fffffffffffffb10)))));
          bVar3 = Lib::Option::operator_cast_to_bool((Option<Kernel::TermList_&> *)0x4268fa);
          if (bVar3) {
            pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                     ::get((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                            *)in_stack_fffffffffffffb00._content,in_stack_fffffffffffffafc);
            pNVar2 = local_a8;
            local_d0 = pTVar8->_content;
            TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb30);
            local_100 = TVar10._inner._inner._0_8_;
            local_e8 = CONCAT31(local_e8._1_3_,TVar10._inner._inner._content[7]);
            local_d8 = local_e8;
            local_f8 = local_e8;
            local_f0 = local_100;
            local_e0 = local_100;
            iVar5 = (*pNVar2->_vptr_Node[10])
                              (pNVar2,local_100,(ulong)TVar10._inner._inner._content[7],0);
            local_d1 = CONCAT44(extraout_var,iVar5) != 0;
            if (!(bool)local_d1) {
              local_b9 = 1;
            }
          }
          else {
            Node::term(local_b8);
            bVar3 = Kernel::TermList::isTerm((TermList *)0x4269e5);
            if (bVar3) {
              Node::term(local_b8);
              Kernel::TermList::term((TermList *)0x426a00);
              bVar3 = Kernel::Term::shared((Term *)0x426a08);
              if (!bVar3) {
                local_99 = 0;
                goto LAB_00426a22;
              }
            }
            local_b9 = 1;
          }
LAB_00426a22:
          if ((local_b9 & 1) != 0) {
            var_00 = *(uint *)&local_a8[1]._vptr_Node;
            pTVar8 = Node::term(local_b8);
            local_118 = pTVar8->_content;
            UnresolvedSplitRecord::UnresolvedSplitRecord(&local_110,var_00,(TermList)local_118);
            UVar11.original._content._0_4_ = in_stack_fffffffffffffb10;
            UVar11._0_8_ = in_stack_fffffffffffffb08._content;
            UVar11.original._content._4_1_ = in_stack_fffffffffffffb14;
            UVar11.original._content._5_1_ = in_stack_fffffffffffffb15;
            UVar11.original._content._6_1_ = in_stack_fffffffffffffb16;
            UVar11.original._content._7_1_ = in_stack_fffffffffffffb17;
            Lib::
            BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
            ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                      *)in_stack_fffffffffffffb00._content,UVar11);
            pNVar2 = local_b8;
            pTVar8 = Node::term(local_a8);
            local_120 = pTVar8->_content;
            Node::setTerm(pNVar2,(TermList)local_120);
            *(Node **)local_20 = local_b8;
            IntermediateNode::makeEmpty((IntermediateNode *)in_stack_fffffffffffffb00._content);
            if (local_a8 != (Node *)0x0) {
              (*local_a8->_vptr_Node[1])();
            }
            goto LAB_004267ff;
          }
        }
      }
      else {
        local_99 = 0;
      }
      bVar4 = Lib::
              BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
              ::isEmpty(&insert::unresolvedSplits);
      bVar3 = (local_99 & 1) != 0;
      local_99 = bVar3 || bVar4;
      if (!bVar3 && !bVar4) {
        while (bVar3 = Lib::
                       BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                       ::isEmpty(&insert::unresolvedSplits), ((bVar3 ^ 0xffU) & 1) != 0) {
          UVar11 = Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                          *)in_stack_fffffffffffffb00._content);
          local_128 = UVar11.original._content;
          local_130 = UVar11.var;
          local_138 = *(Node **)local_20;
          pTVar8 = Node::term(local_138);
          local_148 = pTVar8->_content;
          ts_00._content._7_1_ = in_stack_fffffffffffffb27;
          ts_00._content._0_7_ = in_stack_fffffffffffffb20;
          local_140 = createIntermediateNode(ts_00,(uint)((ulong)in_stack_fffffffffffffb18 >> 0x20))
          ;
          local_150 = local_128._content;
          Node::setTerm(local_138,local_128);
          pIVar6 = local_140;
          *(IntermediateNode **)local_20 = local_140;
          TVar10 = Node::top((Node *)CONCAT17(in_stack_fffffffffffffb17,
                                              CONCAT16(in_stack_fffffffffffffb16,
                                                       CONCAT15(in_stack_fffffffffffffb15,
                                                                CONCAT14(in_stack_fffffffffffffb14,
                                                                         in_stack_fffffffffffffb10))
                                                      )));
          local_188 = TVar10._inner._inner._0_8_;
          local_170 = CONCAT31(local_170._1_3_,TVar10._inner._inner._content[7]);
          local_15c = local_170;
          local_180 = local_170;
          local_178 = local_188;
          local_164 = local_188;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])
                            (pIVar6,local_188,(ulong)TVar10._inner._inner._content[7],1);
          local_158 = (undefined8 *)CONCAT44(extraout_var_00,iVar5);
          *local_158 = local_138;
        }
      }
      local_190 = *(long **)local_20;
      local_1b8._afterLast._4_4_ = (undefined4)local_190[2];
      pTVar8 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>
                           *)in_stack_fffffffffffffb00._content,in_stack_fffffffffffffafc);
      local_1b8._entries = (Entry *)pTVar8->_content;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
                (&local_1b8,(char *)local_10);
      Lib::Option<std::pair<unsigned_int,_Kernel::TermList>_>::~Option
                ((Option<std::pair<unsigned_int,_Kernel::TermList>_> *)0x426d2f);
      plVar1 = local_190;
      local_1c0 = local_20;
      TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb30);
      local_1f0 = TVar10._inner._inner._0_8_;
      local_1d8 = CONCAT31(local_1d8._1_3_,TVar10._inner._inner._content[7]);
      local_1c4 = local_1d8;
      local_1e8 = local_1d8;
      local_1e0 = local_1f0;
      local_1cc = local_1f0;
      local_20 = (uint *)(**(code **)(*plVar1 + 0x50))
                                   (plVar1,local_1f0,TVar10._inner._inner._content[7]);
      if (*(long *)local_20 == 0) {
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
        ::BinaryHeap(&local_208);
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::items
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffb28);
        Lib::
        iterTraits<Lib::VirtualIterator<std::pair<unsigned_int_const&,Kernel::TermList_const&>>>
                  ((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> *)
                   in_stack_fffffffffffffb28);
        Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
        ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                          *)in_stack_fffffffffffffb00._content);
        local_210 = local_218;
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::begin((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                 *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::end((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
               *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        while( true ) {
          bVar3 = Lib::operator!=((StlIter *)in_stack_fffffffffffffb00._content,
                                  (StlIter *)
                                  CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          if (!bVar3) break;
          EVar12 = Lib::
                   IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                   ::StlIter::operator*((StlIter *)0x426f6d);
          local_270 = EVar12;
          local_278 = std::get<0ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x426fb4);
          local_280 = std::get<1ul,unsigned_int_const&,Kernel::TermList_const&>
                                ((pair<const_unsigned_int_&,_const_Kernel::TermList_&> *)0x426fc9);
          local_298 = local_280->_content;
          Binding::Binding(&local_290,*local_278,(TermList)local_298);
          BVar13.term._content._0_4_ = in_stack_fffffffffffffb10;
          BVar13._0_8_ = in_stack_fffffffffffffb08._content;
          BVar13.term._content._4_1_ = in_stack_fffffffffffffb14;
          BVar13.term._content._5_1_ = in_stack_fffffffffffffb15;
          BVar13.term._content._6_1_ = in_stack_fffffffffffffb16;
          BVar13.term._content._7_1_ = in_stack_fffffffffffffb17;
          Lib::
          BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                    *)in_stack_fffffffffffffb00._content,BVar13);
          Lib::
          IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
          ::StlIter::operator++((StlIter *)in_stack_fffffffffffffb30);
        }
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x426eaa);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::~StlIter((StlIter *)0x426eb7);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::~IterTraits((IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                       *)0x426ec4);
        while( true ) {
          bVar3 = Lib::
                  BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                  ::isEmpty(&local_208);
          if (((bVar3 ^ 0xffU) & 1) == 0) break;
          BVar13 = Lib::
                   BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                   ::pop((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                          *)in_stack_fffffffffffffb00._content);
          local_2a0 = (Entry *)BVar13.term._content;
          local_2a8 = BVar13.var;
          local_2b8 = local_1b8._entries;
          ts_01._content._7_1_ = in_stack_fffffffffffffb27;
          ts_01._content._0_7_ = in_stack_fffffffffffffb20;
          pIVar6 = createIntermediateNode(ts_01,(uint)((ulong)in_stack_fffffffffffffb18 >> 0x20));
          local_1b8._entries = local_2a0;
          *(IntermediateNode **)local_20 = pIVar6;
          local_2b0 = pIVar6;
          TVar10 = Kernel::TermList::top((TermList *)in_stack_fffffffffffffb30);
          local_2e8 = TVar10._inner._inner._0_8_;
          local_2d0 = CONCAT31(local_2d0._1_3_,TVar10._inner._inner._content[7]);
          local_2c0 = local_2d0;
          local_2e0 = local_2d0;
          local_2d8 = local_2e8;
          local_2c8 = local_2e8;
          iVar5 = (*(pIVar6->super_Node)._vptr_Node[10])(pIVar6,local_2e8,(ulong)local_2d0,1);
          local_20 = (uint *)CONCAT44(extraout_var_01,iVar5);
        }
        local_2f8 = local_1b8._entries;
        ts._content._4_1_ = in_stack_fffffffffffffb14;
        ts._content._0_4_ = in_stack_fffffffffffffb10;
        ts._content._5_1_ = in_stack_fffffffffffffb15;
        ts._content._6_1_ = in_stack_fffffffffffffb16;
        ts._content._7_1_ = in_stack_fffffffffffffb17;
        pLVar9 = createLeaf(ts);
        *(Leaf **)local_20 = pLVar9;
        local_2f0 = pLVar9;
        Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffb00._content,
                   (Lhs *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        (*(pLVar9->super_Node)._vptr_Node[9])(pLVar9,local_328);
        Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x42725a);
        ensureIntermediateNodeEfficiency((IntermediateNode **)0x427267);
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
        ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                       *)in_stack_fffffffffffffb00._content);
        return;
      }
      local_330 = &local_1b8._entries;
      local_338 = Node::term(*(Node **)local_20);
      Lib::Stack<Kernel::TermList_*>::Stack
                ((Stack<Kernel::TermList_*> *)
                 CONCAT17(in_stack_fffffffffffffb17,
                          CONCAT16(in_stack_fffffffffffffb16,
                                   CONCAT15(in_stack_fffffffffffffb15,
                                            CONCAT14(in_stack_fffffffffffffb14,
                                                     in_stack_fffffffffffffb10)))),
                 in_stack_fffffffffffffb08._content);
LAB_004272e8:
      while (bVar3 = Kernel::TermList::operator!=((TermList *)local_330,local_338), bVar3) {
        local_360 = local_338->_content;
        local_368 = *local_330;
        bVar3 = Kernel::TermList::sameTop(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
        if (!bVar3) break;
        in_stack_fffffffffffffb30 = Kernel::TermList::term((TermList *)0x427361);
        local_370 = in_stack_fffffffffffffb30;
        in_stack_fffffffffffffb28 = Kernel::TermList::term((TermList *)0x427382);
        local_378 = in_stack_fffffffffffffb28;
        in_stack_fffffffffffffb27 = Kernel::Term::shared((Term *)0x4273a3);
        if ((bool)in_stack_fffffffffffffb27) {
          in_stack_fffffffffffffb18 =
               Kernel::Term::cloneNonShared
                         ((Term *)CONCAT17(in_stack_fffffffffffffb27,in_stack_fffffffffffffb20));
          local_370 = in_stack_fffffffffffffb18;
          Kernel::TermList::setTerm
                    ((TermList *)in_stack_fffffffffffffb00._content,
                     (Term *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        }
        local_338 = Kernel::Term::args(local_370);
        local_330 = (Entry **)Kernel::Term::args(local_378);
        Kernel::TermList::next(local_338);
        in_stack_fffffffffffffb17 = Kernel::TermList::isEmpty((TermList *)0x427445);
        if (!(bool)in_stack_fffffffffffffb17) {
          Kernel::TermList::next(local_338);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb00._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Kernel::TermList::next((TermList *)local_330);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb00._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        }
      }
      local_380 = local_338->_content;
      local_388 = *local_330;
      in_stack_fffffffffffffb16 =
           Kernel::TermList::sameTop(in_stack_fffffffffffffb08,in_stack_fffffffffffffb00);
      if (!(bool)in_stack_fffffffffffffb16) {
        in_stack_fffffffffffffb15 = Kernel::TermList::isSpecialVar((TermList *)0x4274f9);
        if ((bool)in_stack_fffffffffffffb15) {
          local_38c = Kernel::TermList::var(local_338);
        }
        else {
          local_38c = *in_RDI;
          *in_RDI = local_38c + 1;
          local_3a8 = local_338->_content;
          UnresolvedSplitRecord::UnresolvedSplitRecord(&local_3a0,local_38c,(TermList)local_3a8);
          obj.original._content._0_4_ = in_stack_fffffffffffffb10;
          obj._0_8_ = in_stack_fffffffffffffb08._content;
          obj.original._content._4_1_ = in_stack_fffffffffffffb14;
          obj.original._content._5_1_ = in_stack_fffffffffffffb15;
          obj.original._content._6_1_ = in_stack_fffffffffffffb16;
          obj.original._content._7_1_ = in_stack_fffffffffffffb17;
          Lib::
          BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
          ::insert((BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::BinaryResolutionConf::Lhs>_>
                    *)in_stack_fffffffffffffb00._content,obj);
          Kernel::TermList::makeSpecialVar(local_338,local_38c);
        }
        local_3b0 = *local_330;
        val._content._7_1_ = in_stack_fffffffffffffb27;
        val._content._0_7_ = in_stack_fffffffffffffb20;
        Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                  ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                   in_stack_fffffffffffffb18,
                   CONCAT13(in_stack_fffffffffffffb17,
                            CONCAT12(in_stack_fffffffffffffb16,
                                     CONCAT11(in_stack_fffffffffffffb15,in_stack_fffffffffffffb14)))
                   ,val);
      }
      bVar3 = Lib::Stack<Kernel::TermList_*>::isEmpty(&local_358);
      if (!bVar3) {
        in_stack_fffffffffffffb08._content = (uint64_t)&local_358;
        local_330 = (Entry **)
                    Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb08._content);
        local_338 = Lib::Stack<Kernel::TermList_*>::pop
                              ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb08._content);
        Kernel::TermList::next(local_338);
        in_stack_fffffffffffffb14 = Kernel::TermList::isEmpty((TermList *)0x427624);
        if (!(bool)in_stack_fffffffffffffb14) {
          Kernel::TermList::next(local_338);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb00._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
          Kernel::TermList::next((TermList *)local_330);
          Lib::Stack<Kernel::TermList_*>::push
                    ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb00._content,
                     (TermList *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        }
        goto LAB_004272e8;
      }
      bVar3 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
              isEmpty(local_10);
      if (bVar3) {
        ensureLeafEfficiency((Leaf **)0x42769e);
        in_stack_fffffffffffffb00._content = *(uint64_t *)local_20;
        local_3b8 = (DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                    in_stack_fffffffffffffb00._content;
        Inferences::ALASCA::BinaryResolutionConf::Lhs::Lhs
                  ((Lhs *)in_stack_fffffffffffffb00._content,
                   (Lhs *)CONCAT44(in_stack_fffffffffffffafc,in_stack_fffffffffffffaf8));
        (**(code **)(*(long *)in_stack_fffffffffffffb00._content + 0x48))
                  (in_stack_fffffffffffffb00._content,local_3e8);
        Inferences::ALASCA::BinaryResolutionConf::Lhs::~Lhs((Lhs *)0x4276fc);
        local_3ec = 1;
      }
      else {
        local_3ec = 2;
      }
      Lib::Stack<Kernel::TermList_*>::~Stack
                ((Stack<Kernel::TermList_*> *)in_stack_fffffffffffffb00._content);
    } while (local_3ec != 1);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}